

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_table_key<toml::type_config>
            (result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  error_info *this;
  value_type *__x;
  error_type *v;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
  *v_00;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
  *ctx_00;
  allocator<char> local_38a;
  allocator<char> local_389;
  string local_388;
  string local_368;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  keys_res;
  location local_2c0;
  location first;
  region reg;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
  local_1c8;
  undefined1 local_148 [176];
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
  local_98;
  
  location::location(&first,loc);
  syntax::std_table((sequence *)&keys_res,&ctx->toml_spec_);
  sequence::scan(&reg,(sequence *)&keys_res,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &keys_res.field_1.succ_);
  if (reg.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"toml::parse_table_key: invalid table key",&local_389);
    syntax::std_table((sequence *)&local_1c8,&ctx->toml_spec_);
    location::location(&local_2c0,loc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"",&local_38a);
    make_syntax_error<toml::detail::sequence>
              ((error_info *)&keys_res,&local_368,(sequence *)&local_1c8,&local_2c0,&local_388);
    this = (error_info *)(local_148 + 0x58);
    err<toml::error_info>((failure<toml::error_info> *)this,(error_info *)&keys_res);
    result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
    ::result(__return_storage_ptr__,(failure_type *)this);
    error_info::~error_info(this);
    error_info::~error_info((error_info *)&keys_res);
    std::__cxx11::string::~string((string *)&local_388);
    location::~location(&local_2c0);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&local_1c8.first.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)&local_368);
  }
  else {
    location::operator=(loc,&first);
    location::advance(loc,1);
    skip_whitespace<toml::type_config>(loc,ctx);
    parse_key<toml::type_config>(&keys_res,loc,ctx);
    if (keys_res.is_ok_ == false) {
      v = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
          ::unwrap_err(&keys_res,(source_location)0x45b658);
      err<toml::error_info>((failure<toml::error_info> *)local_148,v);
      ctx_00 = (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
                *)local_148;
      result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
      ::result(__return_storage_ptr__,(failure_type *)local_148);
      error_info::~error_info((error_info *)local_148);
    }
    else {
      skip_whitespace<toml::type_config>(loc,ctx);
      location::advance(loc,1);
      __x = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
            ::unwrap(&keys_res,(source_location)0x45b670);
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
      ::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region,_true>
                (&local_1c8,&__x->first,&reg);
      ok<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>>
                ((success<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>_>
                  *)&local_98,(toml *)&local_1c8,v_00);
      ctx_00 = &local_98;
      result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
      ::result(__return_storage_ptr__,(success_type *)&local_98);
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
      ::~pair(&local_98);
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
      ::~pair(&local_1c8);
    }
    result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
    ::cleanup(&keys_res,(EVP_PKEY_CTX *)ctx_00);
  }
  region::~region(&reg);
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<std::vector<typename basic_value<TC>::key_type>, region>, error_info>
parse_table_key(location& loc, context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    auto reg = syntax::std_table(spec).scan(loc);
    if(!reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_table_key: invalid table key",
            syntax::std_table(spec), loc));
    }

    loc = first;
    loc.advance(); // skip [
    skip_whitespace(loc, ctx);

    auto keys_res = parse_key(loc, ctx);
    if(keys_res.is_err())
    {
        return err(std::move(keys_res.unwrap_err()));
    }

    skip_whitespace(loc, ctx);
    loc.advance(); // ]

    return ok(std::make_pair(std::move(keys_res.unwrap().first), std::move(reg)));
}